

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::align_struct
          (CompilerMSL *this,SPIRType *ib_type,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *aligned_structs)

{
  ID *this_00;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *t;
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  TypedID<(spirv_cross::Types)1> id;
  uint32_t type;
  size_type sVar4;
  mapped_type *m;
  size_t sVar5;
  TypedID *this_01;
  SPIRType *ib_type_00;
  CompilerError *this_02;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar6;
  uint32_t padding_bytes;
  uint local_78;
  uint32_t spirv_mbr_offset;
  uint32_t aligned_msl_offset;
  uint32_t msl_align_mask;
  uint32_t mbr_idx_1;
  uint32_t msl_offset;
  SPIRType *mbr_type;
  uint32_t mbr_idx;
  uint32_t mbr_cnt;
  MemberSorter member_sorter;
  uint32_t local_30;
  uint32_t local_2c;
  TypedID *local_28;
  ID *ib_type_id;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *aligned_structs_local;
  SPIRType *ib_type_local;
  CompilerMSL *this_local;
  
  local_28 = (TypedID *)&(ib_type->super_IVariant).self;
  ib_type_id = (ID *)aligned_structs;
  aligned_structs_local =
       (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        *)ib_type;
  ib_type_local = (SPIRType *)this;
  local_2c = TypedID::operator_cast_to_unsigned_int(local_28);
  sVar4 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(aligned_structs,&local_2c);
  this_00 = ib_type_id;
  if (sVar4 == 0) {
    local_30 = TypedID::operator_cast_to_unsigned_int(local_28);
    pVar6 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)this_00,&local_30);
    t = aligned_structs_local;
    member_sorter._16_8_ = pVar6.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    m = ::std::
        unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
        ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,(key_type *)local_28);
    MemberSorter::MemberSorter((MemberSorter *)&mbr_idx,(SPIRType *)t,m,Offset);
    MemberSorter::sort((MemberSorter *)&mbr_idx);
    sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                       &aligned_structs_local[2]._M_h._M_rehash_policy._M_next_resize);
    uVar1 = (uint)sVar5;
    for (mbr_type._0_4_ = 0; (uint)mbr_type < uVar1; mbr_type._0_4_ = (uint)mbr_type + 1) {
      this_01 = (TypedID *)
                VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                          ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                           &aligned_structs_local[2]._M_h._M_rehash_policy._M_next_resize,
                           (ulong)(uint)mbr_type);
      uVar2 = TypedID::operator_cast_to_unsigned_int(this_01);
      ib_type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
      if (ib_type_00->basetype == Struct) {
        align_struct(this,ib_type_00,
                     (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)ib_type_id);
      }
    }
    msl_align_mask = 0;
    for (aligned_msl_offset = 0; aligned_msl_offset < uVar1;
        aligned_msl_offset = aligned_msl_offset + 1) {
      ensure_member_packing_rules_msl(this,(SPIRType *)aligned_structs_local,aligned_msl_offset);
      uVar2 = get_declared_struct_member_alignment_msl
                        (this,(SPIRType *)aligned_structs_local,aligned_msl_offset);
      uVar3 = uVar2 - 1;
      local_78 = msl_align_mask + uVar3 & (uVar3 ^ 0xffffffff);
      id = TypedID::operator_cast_to_TypedID(local_28);
      uVar2 = Compiler::get_member_decoration
                        ((Compiler *)this,id.id,aligned_msl_offset,DecorationOffset);
      if (local_78 < uVar2) {
        type = TypedID::operator_cast_to_unsigned_int(local_28);
        Compiler::set_extended_member_decoration
                  ((Compiler *)this,type,aligned_msl_offset,SPIRVCrossDecorationPaddingTarget,
                   uVar2 - local_78);
        msl_align_mask = (uVar2 - local_78) + msl_align_mask;
        local_78 = msl_align_mask + uVar3 & (uVar3 ^ 0xffffffff);
      }
      else if (uVar2 < local_78) {
        this_02 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_02,"Cannot represent buffer block correctly in MSL.");
        __cxa_throw(this_02,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_78 != uVar2) {
        __assert_fail("aligned_msl_offset == spirv_mbr_offset",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x13a3,
                      "void spirv_cross::CompilerMSL::align_struct(SPIRType &, unordered_set<uint32_t> &)"
                     );
      }
      if (aligned_msl_offset + 1 < uVar1) {
        uVar2 = get_declared_struct_member_size_msl
                          (this,(SPIRType *)aligned_structs_local,aligned_msl_offset);
        msl_align_mask = local_78 + uVar2;
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::align_struct(SPIRType &ib_type, unordered_set<uint32_t> &aligned_structs)
{
	// We align structs recursively, so stop any redundant work.
	ID &ib_type_id = ib_type.self;
	if (aligned_structs.count(ib_type_id))
		return;
	aligned_structs.insert(ib_type_id);

	// Sort the members of the interface structure by their offset.
	// They should already be sorted per SPIR-V spec anyway.
	MemberSorter member_sorter(ib_type, ir.meta[ib_type_id], MemberSorter::Offset);
	member_sorter.sort();

	auto mbr_cnt = uint32_t(ib_type.member_types.size());

	for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
	{
		// Pack any dependent struct types before we pack a parent struct.
		auto &mbr_type = get<SPIRType>(ib_type.member_types[mbr_idx]);
		if (mbr_type.basetype == SPIRType::Struct)
			align_struct(mbr_type, aligned_structs);
	}

	// Test the alignment of each member, and if a member should be closer to the previous
	// member than the default spacing expects, it is likely that the previous member is in
	// a packed format. If so, and the previous member is packable, pack it.
	// For example ... this applies to any 3-element vector that is followed by a scalar.
	uint32_t msl_offset = 0;
	for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
	{
		// This checks the member in isolation, if the member needs some kind of type remapping to conform to SPIR-V
		// offsets, array strides and matrix strides.
		ensure_member_packing_rules_msl(ib_type, mbr_idx);

		// Align current offset to the current member's default alignment. If the member was packed, it will observe
		// the updated alignment here.
		uint32_t msl_align_mask = get_declared_struct_member_alignment_msl(ib_type, mbr_idx) - 1;
		uint32_t aligned_msl_offset = (msl_offset + msl_align_mask) & ~msl_align_mask;

		// Fetch the member offset as declared in the SPIRV.
		uint32_t spirv_mbr_offset = get_member_decoration(ib_type_id, mbr_idx, DecorationOffset);
		if (spirv_mbr_offset > aligned_msl_offset)
		{
			// Since MSL and SPIR-V have slightly different struct member alignment and
			// size rules, we'll pad to standard C-packing rules with a char[] array. If the member is farther
			// away than C-packing, expects, add an inert padding member before the the member.
			uint32_t padding_bytes = spirv_mbr_offset - aligned_msl_offset;
			set_extended_member_decoration(ib_type_id, mbr_idx, SPIRVCrossDecorationPaddingTarget, padding_bytes);

			// Re-align as a sanity check that aligning post-padding matches up.
			msl_offset += padding_bytes;
			aligned_msl_offset = (msl_offset + msl_align_mask) & ~msl_align_mask;
		}
		else if (spirv_mbr_offset < aligned_msl_offset)
		{
			// This should not happen, but deal with unexpected scenarios.
			// It *might* happen if a sub-struct has a larger alignment requirement in MSL than SPIR-V.
			SPIRV_CROSS_THROW("Cannot represent buffer block correctly in MSL.");
		}

		assert(aligned_msl_offset == spirv_mbr_offset);

		// Increment the current offset to be positioned immediately after the current member.
		// Don't do this for the last member since it can be unsized, and it is not relevant for padding purposes here.
		if (mbr_idx + 1 < mbr_cnt)
			msl_offset = aligned_msl_offset + get_declared_struct_member_size_msl(ib_type, mbr_idx);
	}
}